

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall
testing::internal::FilePath::MakeFileName
          (FilePath *this,FilePath *directory,FilePath *base_name,int number,char *extension)

{
  char *pcVar1;
  size_t extraout_RDX;
  FilePath FVar2;
  String *in_stack_ffffffffffffff60;
  FilePath local_80;
  String local_70 [2];
  String local_50;
  undefined1 local_40 [8];
  String file;
  char *extension_local;
  int number_local;
  FilePath *base_name_local;
  FilePath *directory_local;
  
  file.length_ = (size_t)extension;
  String::String((String *)local_40);
  if (number == 0) {
    pcVar1 = c_str(base_name);
    String::Format(&local_50,"%s.%s",pcVar1,file.length_);
    String::operator=((String *)local_40,&local_50);
    String::~String(in_stack_ffffffffffffff60);
  }
  else {
    in_stack_ffffffffffffff60 = (String *)c_str(base_name);
    String::Format(local_70,"%s_%d.%s",in_stack_ffffffffffffff60,(ulong)(uint)number,file.length_);
    String::operator=((String *)local_40,local_70);
    String::~String(in_stack_ffffffffffffff60);
  }
  FilePath(&local_80,(String *)local_40);
  ConcatPaths(this,directory,&local_80);
  ~FilePath(&local_80);
  String::~String(in_stack_ffffffffffffff60);
  FVar2.pathname_.length_ = extraout_RDX;
  FVar2.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  String file;
  if (number == 0) {
    file = String::Format("%s.%s", base_name.c_str(), extension);
  } else {
    file = String::Format("%s_%d.%s", base_name.c_str(), number, extension);
  }
  return ConcatPaths(directory, FilePath(file));
}